

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InitCallback(void *pInit,int argc,char **argv,char **NotUsed)

{
  sqlite3 *pData_00;
  char **azObj;
  int iVar1;
  char *zExtra;
  Index *pIndex_00;
  Index *pIndex;
  sqlite3_stmt *pStmt;
  uint local_48;
  int iStack_44;
  u8 saved_iDb;
  int rc;
  int iDb;
  sqlite3 *db;
  InitData *pData;
  char **NotUsed_local;
  char **argv_local;
  void *pvStack_18;
  int argc_local;
  void *pInit_local;
  
  _rc = *pInit;
  iStack_44 = *(int *)((long)pInit + 0x10);
  _rc->mDbFlags = _rc->mDbFlags | 0x40;
  if (argv == (char **)0x0) {
    pInit_local._4_4_ = 0;
  }
  else {
    *(int *)((long)pInit + 0x1c) = *(int *)((long)pInit + 0x1c) + 1;
    db = (sqlite3 *)pInit;
    pData = (InitData *)NotUsed;
    NotUsed_local = argv;
    argv_local._4_4_ = argc;
    pvStack_18 = pInit;
    if (_rc->mallocFailed == '\0') {
      if (argv[3] == (char *)0x0) {
        corruptSchema((InitData *)pInit,argv,(char *)0x0);
      }
      else if (((argv[4] == (char *)0x0) || (""[(byte)*argv[4]] != 'c')) ||
              (""[(byte)argv[4][1]] != 'r')) {
        if ((argv[1] == (char *)0x0) || ((argv[4] != (char *)0x0 && (*argv[4] != '\0')))) {
          corruptSchema((InitData *)pInit,argv,(char *)0x0);
        }
        else {
          pIndex_00 = sqlite3FindIndex(_rc,argv[1],_rc->aDb[iStack_44].zDbSName);
          if (pIndex_00 == (Index *)0x0) {
            corruptSchema((InitData *)db,NotUsed_local,"orphan index");
          }
          else {
            iVar1 = sqlite3GetUInt32(NotUsed_local[3],&pIndex_00->tnum);
            if ((((iVar1 == 0) || (pIndex_00->tnum < 2)) ||
                ((*(uint *)&db->aDb < pIndex_00->tnum ||
                 (iVar1 = sqlite3IndexHasDuplicateRootPage(pIndex_00), iVar1 != 0)))) &&
               (sqlite3Config.bExtraSchemaChecks != '\0')) {
              corruptSchema((InitData *)db,NotUsed_local,"invalid rootpage");
            }
          }
        }
      }
      else {
        pStmt._7_1_ = (_rc->init).iDb;
        (_rc->init).iDb = (u8)iStack_44;
        iVar1 = sqlite3GetUInt32(argv[3],&(_rc->init).newTnum);
        if (((iVar1 == 0) || ((*(uint *)&db->aDb < (_rc->init).newTnum && (*(int *)&db->aDb != 0))))
           && (sqlite3Config.bExtraSchemaChecks != '\0')) {
          corruptSchema((InitData *)db,NotUsed_local,"invalid rootpage");
        }
        (_rc->init).field_0x6 = (_rc->init).field_0x6 & 0xfe;
        (_rc->init).azInit = NotUsed_local;
        pIndex = (Index *)0x0;
        sqlite3Prepare(_rc,NotUsed_local[4],-1,0,(Vdbe *)0x0,(sqlite3_stmt **)&pIndex,(char **)0x0);
        azObj = NotUsed_local;
        pData_00 = db;
        local_48 = _rc->errCode;
        (_rc->init).iDb = pStmt._7_1_;
        if ((local_48 != 0) && (((_rc->init).field_0x6 & 1) == 0)) {
          if (*(int *)((long)&db->pDfltColl + 4) < (int)local_48) {
            *(uint *)((long)&db->pDfltColl + 4) = local_48;
          }
          if (local_48 == 7) {
            sqlite3OomFault(_rc);
          }
          else if ((local_48 != 9) && ((local_48 & 0xff) != 6)) {
            zExtra = sqlite3_errmsg(_rc);
            corruptSchema((InitData *)pData_00,azObj,zExtra);
          }
        }
        (_rc->init).azInit = sqlite3StdType;
        sqlite3_finalize((sqlite3_stmt *)pIndex);
      }
      pInit_local._4_4_ = 0;
    }
    else {
      corruptSchema((InitData *)pInit,argv,(char *)0x0);
      pInit_local._4_4_ = 1;
    }
  }
  return pInit_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3InitCallback(void *pInit, int argc, char **argv, char **NotUsed){
  InitData *pData = (InitData*)pInit;
  sqlite3 *db = pData->db;
  int iDb = pData->iDb;

  assert( argc==5 );
  UNUSED_PARAMETER2(NotUsed, argc);
  assert( sqlite3_mutex_held(db->mutex) );
  db->mDbFlags |= DBFLAG_EncodingFixed;
  if( argv==0 ) return 0;   /* Might happen if EMPTY_RESULT_CALLBACKS are on */
  pData->nInitRow++;
  if( db->mallocFailed ){
    corruptSchema(pData, argv, 0);
    return 1;
  }

  assert( iDb>=0 && iDb<db->nDb );
  if( argv[3]==0 ){
    corruptSchema(pData, argv, 0);
  }else if( argv[4]
         && 'c'==sqlite3UpperToLower[(unsigned char)argv[4][0]]
         && 'r'==sqlite3UpperToLower[(unsigned char)argv[4][1]] ){
    /* Call the parser to process a CREATE TABLE, INDEX or VIEW.
    ** But because db->init.busy is set to 1, no VDBE code is generated
    ** or executed.  All the parser does is build the internal data
    ** structures that describe the table, index, or view.
    **
    ** No other valid SQL statement, other than the variable CREATE statements,
    ** can begin with the letters "C" and "R".  Thus, it is not possible run
    ** any other kind of statement while parsing the schema, even a corrupt
    ** schema.
    */
    int rc;
    u8 saved_iDb = db->init.iDb;
    sqlite3_stmt *pStmt;
    TESTONLY(int rcp);            /* Return code from sqlite3_prepare() */

    assert( db->init.busy );
    db->init.iDb = iDb;
    if( sqlite3GetUInt32(argv[3], &db->init.newTnum)==0
     || (db->init.newTnum>pData->mxPage && pData->mxPage>0)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
    db->init.orphanTrigger = 0;
    db->init.azInit = (const char**)argv;
    pStmt = 0;
    TESTONLY(rcp = ) sqlite3Prepare(db, argv[4], -1, 0, 0, &pStmt, 0);
    rc = db->errCode;
    assert( (rc&0xFF)==(rcp&0xFF) );
    db->init.iDb = saved_iDb;
    /* assert( saved_iDb==0 || (db->mDbFlags & DBFLAG_Vacuum)!=0 ); */
    if( SQLITE_OK!=rc ){
      if( db->init.orphanTrigger ){
        assert( iDb==1 );
      }else{
        if( rc > pData->rc ) pData->rc = rc;
        if( rc==SQLITE_NOMEM ){
          sqlite3OomFault(db);
        }else if( rc!=SQLITE_INTERRUPT && (rc&0xFF)!=SQLITE_LOCKED ){
          corruptSchema(pData, argv, sqlite3_errmsg(db));
        }
      }
    }
    db->init.azInit = sqlite3StdType; /* Any array of string ptrs will do */
    sqlite3_finalize(pStmt);
  }else if( argv[1]==0 || (argv[4]!=0 && argv[4][0]!=0) ){
    corruptSchema(pData, argv, 0);
  }else{
    /* If the SQL column is blank it means this is an index that
    ** was created to be the PRIMARY KEY or to fulfill a UNIQUE
    ** constraint for a CREATE TABLE.  The index should have already
    ** been created when we processed the CREATE TABLE.  All we have
    ** to do here is record the root page number for that index.
    */
    Index *pIndex;
    pIndex = sqlite3FindIndex(db, argv[1], db->aDb[iDb].zDbSName);
    if( pIndex==0 ){
      corruptSchema(pData, argv, "orphan index");
    }else
    if( sqlite3GetUInt32(argv[3],&pIndex->tnum)==0
     || pIndex->tnum<2
     || pIndex->tnum>pData->mxPage
     || sqlite3IndexHasDuplicateRootPage(pIndex)
    ){
      if( sqlite3Config.bExtraSchemaChecks ){
        corruptSchema(pData, argv, "invalid rootpage");
      }
    }
  }
  return 0;
}